

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint8_t n;
  float x1;
  float c;
  float b;
  float a;
  float x2;
  
  a = 0.0;
  b = 0.0;
  c = 0.0;
  iVar1 = 0;
  while( true ) {
    do {
      if (2 < iVar1) {
        printf("Equation: %fx^2%+fx%+f = 0\n",(double)a,(double)b,(double)c);
        solve_quad(a,b,c,&n,&x1,&x2);
        if (n == '\x02') {
          printf("%f and %f are the two solutions to this equation.\n",(double)x1,(double)x2);
        }
        else if (n == '\x01') {
          printf("%f is the only solution.\n",(double)x1);
        }
        else if (n == '\0') {
          puts("No solutions!");
        }
        return 0;
      }
      printf("Please enter the three quadratic arguments separated by a space: ");
      iVar1 = __isoc99_scanf("%f %f %f",&a,&b,&c);
    } while (iVar1 == 3);
    if (iVar1 == -1) break;
    puts("Invalid input!");
    __isoc99_scanf("%*[^\n]");
  }
  putchar(10);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  float a = 0.0, b = 0.0, c = 0.0;
  int scanf_res = 0;
  while (scanf_res < 3) {
    printf("Please enter the three quadratic arguments separated by a space: ");
    scanf_res = scanf("%f %f %f", &a, &b, &c);
    if (scanf_res == EOF) {
      printf("\n");
      return 0;
    } else if (scanf_res != 3) {
      printf("Invalid input!\n");
      scanf("%*[^\n]");
    }
  }
  uint8_t n;
  float x1, x2;
  printf("Equation: %fx^2%+fx%+f = 0\n", a, b, c);
  solve_quad(a, b, c, &n, &x1, &x2);
  if (n == 0) {
    printf("No solutions!\n");
  } else if (n == 1) {
    printf("%f is the only solution.\n", x1);
  } else if (n == 2) {
    printf("%f and %f are the two solutions to this equation.\n", x1, x2);
  }

  // return 0;
}